

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

bool __thiscall Vector::visit(Vector *this,void *ptr,ValueVisitor *visitor)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  
  lVar4 = *ptr;
  Typelib::Indirect::getIndirection();
  lVar1 = Typelib::Type::getSize();
  lVar2 = (**(code **)(*(long *)this + 200))(this,ptr);
  uVar3 = Typelib::Indirect::getIndirection();
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    (**(code **)(*(long *)visitor + 0x98))(visitor,lVar4,uVar3);
    lVar4 = lVar4 + lVar1;
  }
  return true;
}

Assistant:

bool Vector::visit(void* ptr, ValueVisitor& visitor) const
{
    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);
    uint8_t* base = &(*vector_ptr)[0];
    size_t   element_size  = getIndirection().getSize();
    size_t   element_count = getElementCount(vector_ptr);
    const Type &indirect(getIndirection());

    for (size_t i = 0; i < element_count; ++i)
        visitor.dispatch(Value(base + i * element_size, indirect));

    return true;
}